

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O2

maybe<pstore::command_line::option_*,_void> * __thiscall
pstore::maybe<pstore::command_line::option_*,_void>::operator=
          (maybe<pstore::command_line::option_*,_void> *this,
          maybe<pstore::command_line::option_*,_void> *other)

{
  option **other_00;
  
  if (other != this) {
    if (other->valid_ == false) {
      if (this->valid_ == true) {
        this->valid_ = false;
      }
    }
    else {
      other_00 = maybe<pstore::command_line::option*,void>::
                 value_impl<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::option*>
                           (other);
      maybe<pstore::command_line::option*,void>::operator=
                ((maybe<pstore::command_line::option*,void> *)this,other_00);
    }
  }
  return this;
}

Assistant:

maybe &
        operator= (maybe && other) noexcept (std::is_nothrow_move_assignable<T>::value &&
                                                 std::is_nothrow_move_constructible<T>::value) {

            if (&other != this) {
                if (!other.has_value ()) {
                    this->reset ();
                } else {
                    this->operator= (std::forward<T> (other.value ()));
                }
            }
            return *this;
        }